

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O0

void NULLCVector::VectorReserve(uint size,vector *vec)

{
  NULLCArray NVar1;
  char *local_38;
  uint local_30;
  NULLCArray newData;
  vector *vec_local;
  uint size_local;
  
  if ((vec->data).len < size) {
    NVar1 = nullcAllocateArrayTyped((vec->data).typeID,size);
    local_38 = NVar1.ptr;
    local_30 = NVar1.len;
    if (local_38 != (char *)0x0) {
      memcpy(local_38,(vec->data).ptr,(ulong)(vec->elemSize * (vec->data).len));
      (vec->data).ptr = local_38;
      (vec->data).len = local_30;
    }
  }
  return;
}

Assistant:

void VectorReserve(unsigned int size, vector* vec)
	{
		// If not enough space
		if(size > vec->data.len)
		{
			// Allocate new
			NULLCArray newData = nullcAllocateArrayTyped(vec->data.typeID, size);

			if(!newData.ptr)
				return;

			memcpy(newData.ptr, vec->data.ptr, unsigned(vec->elemSize * vec->data.len));

			vec->data.ptr = newData.ptr;
			vec->data.len = newData.len;
		}
	}